

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialect_detection.cpp
# Opt level: O3

void __thiscall
duckdb::DialectCandidates::DialectCandidates
          (DialectCandidates *this,CSVStateMachineOptions *options)

{
  char *__args;
  pointer pcVar1;
  pointer pcVar2;
  iterator __position;
  pointer pQVar3;
  vector<char,_std::allocator<char>_> *pvVar4;
  const_reference pvVar5;
  vector<char,_std::allocator<char>_> *pvVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  vector<char,std::allocator<char>> *this_00;
  QuoteRule *quote_rule;
  allocator_type *paVar9;
  size_type sVar10;
  initializer_list<duckdb::QuoteRule> __l;
  initializer_list<char> __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<char> __l_02;
  initializer_list<char> __l_03;
  initializer_list<duckdb::QuoteRule> __l_04;
  initializer_list<duckdb::QuoteRule> __l_05;
  initializer_list<char> __l_06;
  vector<duckdb::QuoteRule,_true> default_quote_rule;
  vector<char,_true> default_comment;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  default_delimiter;
  vector<duckdb::vector<char,_true>,_true> default_escape;
  vector<duckdb::vector<char,_true>,_true> default_quote;
  allocator_type local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  CSVStateMachineOptions *local_108;
  DialectCandidates *local_100;
  vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_> local_f8;
  _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_e0;
  vector<duckdb::QuoteRule,_true> *local_d8;
  _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_d0;
  pointer local_c8;
  pointer pbStack_c0;
  pointer local_b8;
  vector<char,_true> *local_b0;
  pointer local_a8;
  pointer pbStack_a0;
  pointer local_98;
  vector<char,_std::allocator<char>_> local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_> local_60;
  vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_> local_48;
  
  local_b0 = &this->comment_candidates;
  local_d8 = &this->quote_rule_candidates;
  local_d0 = (_Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->quote_candidates_map;
  (this->quote_rule_candidates).super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
  super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->quote_rule_candidates).super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
  super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->comment_candidates).super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->comment_candidates).super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  (this->delim_candidates).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->comment_candidates).super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->delim_candidates).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->delim_candidates).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->quote_rule_candidates).super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
  super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->quote_candidates_map)._M_h._M_buckets = &(this->quote_candidates_map)._M_h._M_single_bucket
  ;
  (this->quote_candidates_map)._M_h._M_bucket_count = 1;
  (this->quote_candidates_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->quote_candidates_map)._M_h._M_element_count = 0;
  (this->quote_candidates_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->quote_candidates_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->quote_candidates_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_e0 = (_Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->escape_candidates_map;
  (this->escape_candidates_map)._M_h._M_buckets =
       &(this->escape_candidates_map)._M_h._M_single_bucket;
  (this->escape_candidates_map)._M_h._M_bucket_count = 1;
  (this->escape_candidates_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->escape_candidates_map)._M_h._M_element_count = 0;
  (this->escape_candidates_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->escape_candidates_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->escape_candidates_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_108 = options;
  GetDefaultQuote();
  GetDefaultEscape();
  local_128._M_dataplus._M_p._0_3_ = 0x102;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_128;
  ::std::vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>::vector
            (&local_f8,__l,(allocator_type *)&local_c8);
  GetDefaultDelimiter_abi_cxx11_();
  local_128._M_dataplus._M_p._0_2_ = 0x23;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_128;
  ::std::vector<char,_std::allocator<char>_>::vector(&local_90,__l_00,(allocator_type *)&local_c8);
  if (local_f8.super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_f8.super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar10 = 0;
    do {
      pvVar4 = &vector<duckdb::vector<char,_true>,_true>::operator[]
                          ((vector<duckdb::vector<char,_true>,_true> *)&local_60,sVar10)->
                super_vector<char,_std::allocator<char>_>;
      pvVar5 = vector<duckdb::QuoteRule,_true>::operator[]
                         ((vector<duckdb::QuoteRule,_true> *)&local_f8,sVar10);
      local_128._M_dataplus._M_p._0_1_ = *pvVar5;
      pvVar6 = &::std::__detail::
                _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](local_e0,(key_type *)&local_128)->
                super_vector<char,_std::allocator<char>_>;
      ::std::vector<char,_std::allocator<char>_>::operator=(pvVar6,pvVar4);
      sVar10 = sVar10 + 1;
    } while (sVar10 < (ulong)((long)local_f8.
                                    super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_f8.
                                   super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>
                                   ._M_impl.super__Vector_impl_data._M_start));
  }
  local_100 = this;
  if ((local_108->delimiter).set_by_user == false) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,&local_78);
  }
  else {
    pcVar1 = (local_108->delimiter).value._M_dataplus._M_p;
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,pcVar1,pcVar1 + (local_108->delimiter).value._M_string_length);
    __l_01._M_len = 1;
    __l_01._M_array = &local_128;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_a8,__l_01,&local_129);
    local_b8 = (local_100->delim_candidates).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (local_100->delim_candidates).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_98;
    local_c8 = (local_100->delim_candidates).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pbStack_c0 = (local_100->delim_candidates).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    (local_100->delim_candidates).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_a8;
    (local_100->delim_candidates).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbStack_a0;
    local_a8 = (pointer)0x0;
    pbStack_a0 = (pointer)0x0;
    local_98 = (pointer)0x0;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_c8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_a8);
    this = local_100;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
      this = local_100;
    }
  }
  if ((local_108->comment).set_by_user == true) {
    local_c8 = (pointer)CONCAT71(local_c8._1_7_,(local_108->comment).value);
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)&local_c8;
    ::std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_128,__l_02,(allocator_type *)&local_a8)
    ;
    pcVar2 = (this->comment_candidates).super_vector<char,_std::allocator<char>_>.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    (this->comment_candidates).super_vector<char,_std::allocator<char>_>.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         local_128._M_dataplus._M_p;
    (this->comment_candidates).super_vector<char,_std::allocator<char>_>.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_128._M_string_length;
    (this->comment_candidates).super_vector<char,_std::allocator<char>_>.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_128.field_2._M_allocated_capacity;
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    if ((pcVar2 != (pointer)0x0) &&
       (operator_delete(pcVar2),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_128._M_dataplus._M_p !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      operator_delete(local_128._M_dataplus._M_p);
    }
  }
  else {
    ::std::vector<char,_std::allocator<char>_>::operator=
              (&local_b0->super_vector<char,_std::allocator<char>_>,&local_90);
  }
  if ((local_108->quote).set_by_user == false) {
    if (local_f8.super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_f8.super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
        super__Vector_impl_data._M_start) {
      sVar10 = 0;
      do {
        pvVar4 = &vector<duckdb::vector<char,_true>,_true>::operator[]
                            ((vector<duckdb::vector<char,_true>,_true> *)&local_48,sVar10)->
                  super_vector<char,_std::allocator<char>_>;
        pvVar5 = vector<duckdb::QuoteRule,_true>::operator[]
                           ((vector<duckdb::QuoteRule,_true> *)&local_f8,sVar10);
        local_128._M_dataplus._M_p._0_1_ = *pvVar5;
        pvVar6 = &::std::__detail::
                  _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](local_d0,(key_type *)&local_128)->
                  super_vector<char,_std::allocator<char>_>;
        ::std::vector<char,_std::allocator<char>_>::operator=(pvVar6,pvVar4);
        sVar10 = sVar10 + 1;
      } while (sVar10 < (ulong)((long)local_f8.
                                      super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_f8.
                                     super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
    }
  }
  else {
    if (local_f8.super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_f8.super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      paVar9 = (allocator_type *)
               local_f8.super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        local_c8 = (pointer)CONCAT71(local_c8._1_7_,(local_108->quote).value);
        __l_03._M_len = 1;
        __l_03._M_array = (iterator)&local_c8;
        ::std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&local_128,__l_03,
                   (allocator_type *)&local_a8);
        local_129 = *paVar9;
        pmVar7 = ::std::__detail::
                 _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_d0,(key_type *)&local_129);
        pcVar2 = (pmVar7->super_vector<char,_std::allocator<char>_>).
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        (pmVar7->super_vector<char,_std::allocator<char>_>).
        super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
             local_128._M_dataplus._M_p;
        (pmVar7->super_vector<char,_std::allocator<char>_>).
        super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)local_128._M_string_length;
        (pmVar7->super_vector<char,_std::allocator<char>_>).
        super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)local_128.field_2._M_allocated_capacity;
        local_128._M_dataplus._M_p = (pointer)0x0;
        local_128._M_string_length = 0;
        local_128.field_2._M_allocated_capacity = 0;
        if ((pcVar2 != (pointer)0x0) &&
           (operator_delete(pcVar2),
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_128._M_dataplus._M_p !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0)) {
          operator_delete(local_128._M_dataplus._M_p);
        }
        paVar9 = paVar9 + 1;
      } while (paVar9 != (allocator_type *)
                         local_f8.
                         super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    }
    this = local_100;
    uVar8 = (ulong)(byte)(local_108->quote).value;
    if ((0x27 < uVar8) || ((0x8400000001U >> (uVar8 & 0x3f) & 1) == 0)) {
      local_128._M_dataplus._M_p = local_128._M_dataplus._M_p & 0xffffffffffffff00;
      this_00 = (vector<char,std::allocator<char>> *)
                ::std::__detail::
                _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](local_e0,(key_type *)&local_128);
      __args = &(local_108->quote).value;
      __position._M_current = *(char **)(this_00 + 8);
      if (__position._M_current == *(char **)(this_00 + 0x10)) {
        ::std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                  (this_00,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 1;
      }
    }
  }
  if ((local_108->escape).set_by_user == true) {
    if ((local_108->escape).value == '\0') {
      local_c8 = (pointer)((ulong)local_c8._1_7_ << 8);
      __l_05._M_len = 1;
      __l_05._M_array = (iterator)&local_c8;
      ::std::vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>::vector
                ((vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_> *)&local_128,__l_05,
                 (allocator_type *)&local_a8);
    }
    else {
      local_c8 = (pointer)CONCAT71(local_c8._1_7_,1);
      __l_04._M_len = 1;
      __l_04._M_array = (iterator)&local_c8;
      ::std::vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>::vector
                ((vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_> *)&local_128,__l_04,
                 (allocator_type *)&local_a8);
    }
    pQVar3 = (this->quote_rule_candidates).
             super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
             super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->quote_rule_candidates).
    super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
    super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_128._M_dataplus._M_p;
    (this->quote_rule_candidates).
    super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
    super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_128._M_string_length;
    (this->quote_rule_candidates).
    super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
    super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_128.field_2._M_allocated_capacity;
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    if ((pQVar3 != (pointer)0x0) &&
       (operator_delete(pQVar3), local_128._M_dataplus._M_p != (pointer)0x0)) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    local_c8 = (pointer)CONCAT71(local_c8._1_7_,(local_108->escape).value);
    __l_06._M_len = 1;
    __l_06._M_array = (iterator)&local_c8;
    ::std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_128,__l_06,(allocator_type *)&local_a8)
    ;
    paVar9 = (allocator_type *)vector<duckdb::QuoteRule,_true>::operator[](local_d8,0);
    local_129 = *paVar9;
    pmVar7 = ::std::__detail::
             _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](local_e0,(key_type *)&local_129);
    pcVar2 = (pmVar7->super_vector<char,_std::allocator<char>_>).
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    (pmVar7->super_vector<char,_std::allocator<char>_>).
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         local_128._M_dataplus._M_p;
    (pmVar7->super_vector<char,_std::allocator<char>_>).
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_128._M_string_length;
    (pmVar7->super_vector<char,_std::allocator<char>_>).
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_128.field_2._M_allocated_capacity;
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    if ((pcVar2 != (pointer)0x0) &&
       (operator_delete(pcVar2),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_128._M_dataplus._M_p !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      operator_delete(local_128._M_dataplus._M_p);
    }
  }
  else {
    ::std::vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>::operator=
              (&local_d8->super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>,
               &local_f8);
  }
  if (local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_78);
  if ((allocator_type *)
      local_f8.super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
      super__Vector_impl_data._M_start != (allocator_type *)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  ::std::vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_>::~vector
            (&local_60);
  ::std::vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_>::~vector
            (&local_48);
  return;
}

Assistant:

DialectCandidates::DialectCandidates(const CSVStateMachineOptions &options) {
	// assert that quotes escapes and rules have equal size
	const auto default_quote = GetDefaultQuote();
	const auto default_escape = GetDefaultEscape();
	const auto default_quote_rule = GetDefaultQuoteRule();
	const auto default_delimiter = GetDefaultDelimiter();
	const auto default_comment = GetDefaultComment();

	D_ASSERT(default_quote.size() == default_quote_rule.size() && default_quote_rule.size() == default_escape.size());
	// fill the escapes
	for (idx_t i = 0; i < default_quote_rule.size(); i++) {
		escape_candidates_map[static_cast<uint8_t>(default_quote_rule[i])] = default_escape[i];
	}

	if (options.delimiter.IsSetByUser()) {
		// user provided a delimiter: use that delimiter
		delim_candidates = {options.delimiter.GetValue()};
	} else {
		// no delimiter provided: try standard/common delimiters
		delim_candidates = default_delimiter;
	}
	if (options.comment.IsSetByUser()) {
		// user provided comment character: use that as a comment
		comment_candidates = {options.comment.GetValue()};
	} else {
		// no comment provided: try standard/common comments
		comment_candidates = default_comment;
	}
	if (options.quote.IsSetByUser()) {
		// user provided quote: use that quote rule
		for (auto &quote_rule : default_quote_rule) {
			quote_candidates_map[static_cast<uint8_t>(quote_rule)] = {options.quote.GetValue()};
		}
		// also add it as an escape rule
		if (!IsQuoteDefault(options.quote.GetValue())) {
			escape_candidates_map[static_cast<uint8_t>(QuoteRule::QUOTES_RFC)].emplace_back(options.quote.GetValue());
		}
	} else {
		// no quote rule provided: use standard/common quotes
		for (idx_t i = 0; i < default_quote_rule.size(); i++) {
			quote_candidates_map[static_cast<uint8_t>(default_quote_rule[i])] = {default_quote[i]};
		}
	}
	if (options.escape.IsSetByUser()) {
		// user provided escape: use that escape rule
		if (options.escape == '\0') {
			quote_rule_candidates = {QuoteRule::QUOTES_RFC};
		} else {
			quote_rule_candidates = {QuoteRule::QUOTES_OTHER};
		}
		escape_candidates_map[static_cast<uint8_t>(quote_rule_candidates[0])] = {options.escape.GetValue()};
	} else {
		// no escape provided: try standard/common escapes
		quote_rule_candidates = default_quote_rule;
	}
}